

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacency.cpp
# Opt level: O3

char * __thiscall
glcts::GeometryShaderAdjacency::getFragmentShaderCode(GeometryShaderAdjacency *this)

{
  return "${VERSION}\n\nprecision highp float;\n\nvoid main()\n{\n}\n";
}

Assistant:

const char* GeometryShaderAdjacency::getFragmentShaderCode()
{
	static const char* result = "${VERSION}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"void main()\n"
								"{\n"
								"}\n";
	return result;
}